

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::OP_StEnvSlot
          (InterpreterStackFrame *this,Var instance,int32 slotIndex1,int32 slotIndex2,Var value)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  undefined4 *puVar4;
  long lVar5;
  
  sourceContextId = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
  lVar1 = *(long *)(this + 0x88);
  lVar5 = *(long *)(lVar1 + 0x10);
  if (lVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    lVar5 = *(long *)(lVar1 + 0x10);
  }
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015a4e90,ClosureRangeCheckPhase,sourceContextId,
                            *(LocalFunctionId *)(lVar5 + 0x10));
  if ((!bVar3) && ((ulong)*(ushort *)((long)instance + 2) <= (long)slotIndex1 - 1U)) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  OP_StSlot(this,*(Var *)((long)instance + (long)slotIndex1 * 8),slotIndex2,value);
  return;
}

Assistant:

void InterpreterStackFrame::OP_StEnvSlot(Var instance, int32 slotIndex1, int32 slotIndex2, Var value)
    {
        Var slotArray = (Var*)OP_LdFrameDisplaySlot(instance, slotIndex1);
        OP_StSlot(slotArray, slotIndex2, value);
    }